

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall
ExprVisitorTest_VisitImplication_Test::TestBody(ExprVisitorTest_VisitImplication_Test *this)

{
  LogicalConstant other;
  LogicalConstant other_00;
  LogicalConstant other_01;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_02;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_03;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_04;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_05;
  LogicalExpr else_expr;
  LogicalExpr condition;
  CStringRef arg0;
  bool bVar1;
  Message *message;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *this_00;
  MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *this_01;
  long in_RDI;
  StrictMock<MockUnhandledVisitor> visitor;
  UnsupportedError *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  LogicalExpr base;
  ImplicationExpr e;
  BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes> *in_stack_00000408;
  ExprBase in_stack_00000410;
  Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_fffffffffffffd38;
  MockVisitor *in_stack_fffffffffffffd40;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  Kind in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  ExprBase in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  Type in_stack_fffffffffffffd6c;
  AssertionResult *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  ExprBase in_stack_fffffffffffffd80;
  AssertHelper *this_02;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  MockSpec<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)>
  *in_stack_fffffffffffffe50;
  BasicCStringRef<char> local_d0;
  string local_c8 [32];
  AssertionResult local_a8;
  undefined8 local_90;
  Impl *local_80;
  undefined8 local_78;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_60;
  AssertHelper local_58 [3];
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_20;
  Impl *local_10;
  
  local_20 = *(undefined8 *)(in_RDI + 0x1cc8);
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd54;
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd50;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffd48,other,
             (type_conflict)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  local_30 = *(undefined8 *)(in_RDI + 0x1cc8);
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd54;
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd50;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffd48,other_00
             ,(type_conflict)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  local_40 = *(undefined8 *)(in_RDI + 0x1cc8);
  other_01.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd54;
  other_01.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd50;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffd48,other_01
             ,(type_conflict)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  condition.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd6c;
  condition.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd68;
  else_expr.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd5c;
  else_expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd58;
  local_60.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),condition,
                  (LogicalExpr)in_stack_fffffffffffffd60.impl_,else_expr);
  message = (Message *)(in_RDI + 0x48);
  this_02 = local_58;
  local_10 = (Impl *)local_60.super_ExprBase.impl_;
  testing::
  Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>_>
  ::Matcher((Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>_>
             *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
            (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)
            in_stack_fffffffffffffd80.impl_);
  MockVisitor::gmock_VisitImplication
            (in_stack_fffffffffffffd40,
             (Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>_>
              *)in_stack_fffffffffffffd38);
  testing::internal::
  MockSpec<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)>
  ::InternalExpectedAt
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
             in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  testing::
  Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>_>
  ::~Matcher((Matcher<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>_>
              *)0x14715c);
  local_80 = local_10;
  other_02.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd54;
  other_02.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd50;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffd48,other_02
             ,(type_conflict)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  local_90 = local_78;
  other_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd54;
  other_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd50;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            (in_stack_fffffffffffffd48,other_03,
             (type_conflict)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)in_stack_00000408
             ,(Expr)in_stack_00000410.impl_);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_d0,"unsupported: {}");
    mp::internal::ExprBase::kind((ExprBase *)0x147222);
    in_stack_fffffffffffffd80.impl_ = (Impl *)mp::expr::str(in_stack_fffffffffffffd54);
    arg0.data_._7_1_ = in_stack_fffffffffffffd7f;
    arg0.data_._0_7_ = in_stack_fffffffffffffd78;
    fmt::format<char_const*>(arg0,(char **)in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd7f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd7f) {
      testing::StrictMock<NullVisitor>::StrictMock
                ((StrictMock<NullVisitor> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      other_04.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd54;
      other_04.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd50;
      mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                (in_stack_fffffffffffffd48,other_04,
                 (type_conflict)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 in_stack_00000408,(Expr)in_stack_00000410.impl_);
      testing::StrictMock<NullVisitor>::~StrictMock
                ((StrictMock<NullVisitor> *)in_stack_fffffffffffffd40);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffd70,
               (char (*) [127])CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    std::__cxx11::string::~string(local_c8);
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffd70);
  this_00 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
            testing::AssertionResult::failure_message((AssertionResult *)0x1475b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
             (char *)in_stack_fffffffffffffd60.impl_,in_stack_fffffffffffffd5c,
             (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  testing::internal::AssertHelper::operator=(this_02,message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd40);
  testing::Message::~Message((Message *)0x147615);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14766d);
  testing::StrictMock<MockUnhandledVisitor>::StrictMock
            ((StrictMock<MockUnhandledVisitor> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)in_stack_fffffffffffffd80.impl_);
  this_01 = MockUnhandledVisitor::gmock_VisitLogical
                      ((MockUnhandledVisitor *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  testing::internal::MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
  InternalExpectedAt((MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *
                     )in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x1476f0);
  other_05.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd54;
  other_05.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd50;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            (this_00,other_05,(type_conflict)((ulong)this_01 >> 0x20));
  mp::BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            (in_stack_00000408,(Expr)in_stack_00000410.impl_);
  testing::StrictMock<MockUnhandledVisitor>::~StrictMock
            ((StrictMock<MockUnhandledVisitor> *)this_01);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitImplication) {
  auto e = factory_.MakeImplication(false_, false_, false_);
  EXPECT_CALL(visitor_, VisitImplication(e));
  mp::LogicalExpr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED_LOGICAL(base);
}